

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_record.cc
# Opt level: O3

void __thiscall RecordField::~RecordField(RecordField *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

RecordField::~RecordField()
	{
	delete begin_of_field_dataptr;
	delete end_of_field_dataptr;
	delete[] field_size_expr;
	delete[] field_offset_expr;
	delete end_of_field_dataptr_var;
	}